

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

qsizetype QtPrivate::indexOf<ProString,char[9]>
                    (QList<ProString> *vector,char (*u) [9],qsizetype from)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  ProString *this;
  long lVar6;
  qsizetype qVar7;
  
  uVar1 = (vector->d).size;
  uVar4 = from;
  if (from < 0) {
    uVar4 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar4 = 0;
    }
  }
  qVar7 = -1;
  if (uVar4 < uVar1) {
    this = (vector->d).ptr + uVar4;
    lVar5 = uVar1 * 0x30 + uVar4 * -0x30;
    lVar2 = 0x30 - (long)this;
    do {
      lVar6 = lVar2;
      if (lVar5 == 0) {
        return -1;
      }
      bVar3 = ProString::operator==(this,*u);
      this = this + 1;
      lVar5 = lVar5 + -0x30;
      lVar2 = lVar6 + -0x30;
    } while (!bVar3);
    qVar7 = (-((long)&(vector->d).ptr[-1].m_string.d.d + lVar6) >> 4) * -0x5555555555555555;
  }
  return qVar7;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}